

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  pointer pNVar3;
  undefined8 *in_RSI;
  int in_EDI;
  bool bVar4;
  runtime_error *er;
  unique_ptr<Node,_std::default_delete<Node>_> program;
  Executor executor;
  SemanticAnalyser semantic;
  Parser parser;
  ifstream sourceFile;
  Executor *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  unique_ptr<Node,_std::default_delete<Node>_> *in_stack_fffffffffffffa90;
  Executor *in_stack_fffffffffffffaa0;
  undefined1 local_548 [192];
  Parser *in_stack_fffffffffffffb78;
  undefined1 local_318 [240];
  uint local_228;
  undefined1 local_218 [520];
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 2) {
    std::ifstream::ifstream(local_218,in_RSI[1],8);
    bVar1 = std::ifstream::is_open();
    bVar4 = (bVar1 & 1) != 0;
    if (bVar4) {
      Parser::Parser((Parser *)CONCAT17(bVar1,in_stack_fffffffffffffa80),
                     (istream *)in_stack_fffffffffffffa78);
      SemanticAnalyser::SemanticAnalyser((SemanticAnalyser *)in_stack_fffffffffffffaa0);
      Executor::Executor(in_stack_fffffffffffffaa0);
      Parser::parseProgram(in_stack_fffffffffffffb78);
      pNVar3 = std::unique_ptr<Node,_std::default_delete<Node>_>::operator->
                         ((unique_ptr<Node,_std::default_delete<Node>_> *)0x18251f);
      (*pNVar3->_vptr_Node[2])(pNVar3,local_318);
      pNVar3 = std::unique_ptr<Node,_std::default_delete<Node>_>::operator->
                         ((unique_ptr<Node,_std::default_delete<Node>_> *)0x18253f);
      (*pNVar3->_vptr_Node[2])(pNVar3,local_548);
      std::ifstream::close();
      Executor::getStandardOut_abi_cxx11_(in_stack_fffffffffffffa78);
      std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffa90);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa90);
      std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(in_stack_fffffffffffffa90);
      Executor::~Executor((Executor *)CONCAT17(bVar1,in_stack_fffffffffffffa80));
      SemanticAnalyser::~SemanticAnalyser
                ((SemanticAnalyser *)CONCAT17(bVar1,in_stack_fffffffffffffa80));
      Parser::~Parser((Parser *)0x1825bd);
    }
    else {
      std::operator<<((ostream *)&std::cout,"Could not open provided source file!\n");
      local_4 = 0;
    }
    local_228 = (uint)!bVar4;
    std::ifstream::~ifstream(local_218);
    if (local_228 == 0) {
      local_4 = 0;
    }
  }
  else {
    local_10 = in_RSI;
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,(char *)*local_10);
    std::operator<<(poVar2," source_file\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  if(argc != 2)
  {
    std::cout << "Usage: " << argv[0] << " source_file\n";
    return 0;
  }

  try
  {
    std::ifstream sourceFile{argv[1]};
    if(!sourceFile.is_open())
    {
      std::cout << "Could not open provided source file!\n";
      return 0;
    }

    Parser parser{sourceFile};
    //PrintVisitor printer{};
    SemanticAnalyser semantic{};
    Executor executor{};
    
    auto program = parser.parseProgram();
    //program->accept(printer);
    program->accept(semantic);
    program->accept(executor);
    
    sourceFile.close();

    std::cout << executor.getStandardOut();
  }
  catch(std::runtime_error& er)
  {
    std::cout << er.what() << "\n";
  }

  return 0;
}